

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

void __thiscall gmath::Camera::~Camera(Camera *this)

{
  code *pcVar1;
  Camera *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Camera() {}